

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resCore.c
# Opt level: O3

int Abc_NtkResynthesize(Abc_Ntk_t *pNtk,Res_Par_t *pPars)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Abc_Obj_t *pNode;
  Res_Win_t *pRVar3;
  int iVar4;
  int iVar5;
  Res_Man_t *p;
  ProgressBar *p_00;
  Vec_Ptr_t *pVVar6;
  Abc_Ntk_t *pAVar7;
  Vec_Vec_t *pVVar8;
  Sto_Man_t *pSVar9;
  Kit_Graph_t *pGraph;
  long lVar10;
  long lVar11;
  Hop_Obj_t *pFunc;
  long lVar12;
  long lVar13;
  timespec ts;
  uint *puTruth;
  timespec local_70;
  ProgressBar *local_60;
  Hop_Obj_t *local_58;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  uint *local_38;
  
  iVar4 = clock_gettime(3,&local_70);
  if (iVar4 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
  }
  p = Res_ManAlloc(pPars);
  iVar4 = Abc_NtkGetTotalFanins(pNtk);
  p->nTotalNets = iVar4;
  p->nTotalNodes = pNtk->nObjCounts[7];
  iVar4 = Abc_NtkGetFaninMax(pNtk);
  local_48 = 8;
  if (iVar4 < 8) {
    local_48 = iVar4;
  }
  iVar5 = 0;
  Abc_NtkSweep(pNtk,0);
  iVar4 = Abc_NtkToAig(pNtk);
  if (iVar4 == 0) {
    fwrite("Converting to BDD has failed.\n",0x1e,1,_stdout);
    Res_ManFree(p);
  }
  else {
    local_40 = lVar13;
    if (pNtk->ntkFunc != ABC_FUNC_AIG) {
      __assert_fail("Abc_NtkHasAig(pNtk)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resCore.c"
                    ,0xf3,"int Abc_NtkResynthesize(Abc_Ntk_t *, Res_Par_t *)");
    }
    Abc_NtkLevel(pNtk);
    Abc_NtkStartReverseLevels(pNtk,pPars->nGrowthLevel);
    local_44 = pNtk->vObjs->nSize;
    p_00 = Extra_ProgressBarStart((FILE *)_stdout,local_44);
    pVVar6 = pNtk->vObjs;
    if (0 < pVVar6->nSize) {
      lVar13 = 0;
      local_60 = p_00;
      do {
        pNode = (Abc_Obj_t *)pVVar6->pArray[lVar13];
        if (pNode != (Abc_Obj_t *)0x0) {
          if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar13)) {
            Extra_ProgressBarUpdate_int(p_00,(int)lVar13,(char *)0x0);
          }
          if (((*(uint *)&pNode->field_0x14 & 0xf) == 7) && ((pNode->vFanins).nSize < 9)) {
            if (local_44 < pNode->Id) break;
            iVar4 = clock_gettime(3,&local_70);
            if (iVar4 < 0) {
              lVar10 = 1;
            }
            else {
              lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
              lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_70.tv_sec * -1000000;
            }
            iVar4 = p->pPars->nWindow;
            iVar4 = Res_WinCompute(pNode,iVar4 / 10,iVar4 % 10,p->pWin);
            iVar5 = clock_gettime(3,&local_70);
            if (iVar5 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
            }
            p->timeWin = p->timeWin + lVar11 + lVar10;
            p_00 = local_60;
            if (iVar4 != 0) {
              iVar4 = Res_WinIsTrivial(p->pWin);
              p->nWinsTriv = p->nWinsTriv + iVar4;
              if (p->pPars->fVeryVerbose != 0) {
                printf("%5d (lev=%2d) : ",(ulong)(uint)pNode->Id,
                       (ulong)(*(uint *)&pNode->field_0x14 >> 0xc));
                pRVar3 = p->pWin;
                printf("Win = %3d/%3d/%4d/%3d   ",(ulong)(uint)pRVar3->vLeaves->nSize,
                       (ulong)(uint)pRVar3->vBranches->nSize,(ulong)(uint)pRVar3->vNodes->nSize,
                       (ulong)(uint)pRVar3->vRoots->nSize);
              }
              iVar4 = clock_gettime(3,&local_70);
              if (iVar4 < 0) {
                lVar10 = 1;
              }
              else {
                lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
                lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_70.tv_sec * -1000000;
              }
              pRVar3 = p->pWin;
              iVar4 = Abc_ObjRequiredLevel(pNode);
              Res_WinDivisors(pRVar3,iVar4 + -1);
              iVar4 = clock_gettime(3,&local_70);
              if (iVar4 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
              }
              p->timeDiv = p->timeDiv + lVar11 + lVar10;
              uVar1 = p->nWins;
              uVar2 = p->nWinNodes;
              iVar4 = p->pWin->vNodes->nSize;
              p->nWins = uVar1 + 1;
              p->nWinNodes = iVar4 + uVar2;
              p->nDivNodes = p->nDivNodes + p->pWin->vDivs->nSize;
              if (p->pPars->fVeryVerbose != 0) {
                printf("D = %3d ");
                printf("D+ = %3d ",(ulong)(uint)p->pWin->nDivsPlus);
              }
              iVar4 = clock_gettime(3,&local_70);
              if (iVar4 < 0) {
                lVar10 = 1;
              }
              else {
                lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
                lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_70.tv_sec * -1000000;
              }
              if (p->pAig != (Abc_Ntk_t *)0x0) {
                Abc_NtkDelete(p->pAig);
              }
              pAVar7 = Res_WndStrash(p->pWin);
              p->pAig = pAVar7;
              iVar4 = clock_gettime(3,&local_70);
              if (iVar4 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
              }
              p->timeAig = p->timeAig + lVar11 + lVar10;
              if (p->pPars->fVeryVerbose != 0) {
                printf("AIG = %4d ",(ulong)(uint)p->pAig->nObjCounts[7]);
                putchar(10);
              }
              iVar4 = clock_gettime(3,&local_70);
              if (iVar4 < 0) {
                lVar10 = 1;
              }
              else {
                lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
                lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_70.tv_sec * -1000000;
              }
              iVar4 = Res_SimPrepare(p->pSim,p->pAig,p->pWin->vLeaves->nSize,0);
              iVar5 = clock_gettime(3,&local_70);
              p_00 = local_60;
              if (iVar5 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
              }
              p->timeSim = p->timeSim + lVar11 + lVar10;
              if (iVar4 == 0) {
                p->nSimEmpty = p->nSimEmpty + 1;
              }
              else {
                iVar4 = p->pSim->fConst1;
                if (p->pSim->fConst0 == 0) {
                  if (iVar4 != 0) {
                    p->nConstsUsed = p->nConstsUsed + 1;
                    goto LAB_00485399;
                  }
                  iVar4 = clock_gettime(3,&local_70);
                  if (iVar4 < 0) {
                    lVar10 = 1;
                  }
                  else {
                    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
                    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_70.tv_sec * -1000000;
                  }
                  iVar4 = Res_FilterCandidates
                                    (p->pWin,p->pAig,p->pSim,p->vResubs,p->vResubsW,local_48,
                                     (uint)(p->pPars->fArea != 0));
                  iVar5 = clock_gettime(3,&local_70);
                  if (iVar5 < 0) {
                    lVar11 = -1;
                  }
                  else {
                    lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
                  }
                  p->timeCand = p->timeCand + lVar11 + lVar10;
                  p->nCandSets = p->nCandSets + iVar4;
                  p_00 = local_60;
                  if (iVar4 != 0) {
                    p->nWinsUsed = p->nWinsUsed + 1;
                    pVVar8 = p->vResubs;
                    if (0 < pVVar8->nSize) {
                      lVar10 = 0;
                      do {
                        local_58 = (Hop_Obj_t *)pVVar8->pArray[lVar10];
                        p_00 = local_60;
                        if (*(int *)((long)&local_58->field_0 + 4) == 0) break;
                        iVar4 = clock_gettime(3,&local_70);
                        if (iVar4 < 0) {
                          lVar11 = 1;
                        }
                        else {
                          lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8
                                         );
                          lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_70.tv_sec * -1000000;
                        }
                        if (p->pCnf != (Sto_Man_t *)0x0) {
                          Sto_ManFree(p->pCnf);
                        }
                        pSVar9 = (Sto_Man_t *)Res_SatProveUnsat(p->pAig,(Vec_Ptr_t *)local_58);
                        p->pCnf = pSVar9;
                        if (pSVar9 == (Sto_Man_t *)0x0) {
                          iVar4 = clock_gettime(3,&local_70);
                          if (iVar4 < 0) {
                            lVar12 = -1;
                          }
                          else {
                            lVar12 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
                          }
                          p->timeSatSat = p->timeSatSat + lVar12 + lVar11;
                        }
                        else {
                          iVar4 = clock_gettime(3,&local_70);
                          if (iVar4 < 0) {
                            lVar12 = -1;
                          }
                          else {
                            lVar12 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
                          }
                          p->timeSatUnsat = p->timeSatUnsat + lVar12 + lVar11;
                          p->nProvedSets = p->nProvedSets + 1;
                          iVar4 = clock_gettime(3,&local_70);
                          if (iVar4 < 0) {
                            lVar11 = 1;
                          }
                          else {
                            lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec)
                                            ,8);
                            lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_70.tv_sec * -1000000
                            ;
                          }
                          local_4c = Int_ManInterpolate(p->pMan,p->pCnf,0,&local_38);
                          iVar4 = clock_gettime(3,&local_70);
                          if (iVar4 < 0) {
                            lVar12 = -1;
                          }
                          else {
                            lVar12 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
                          }
                          p->timeInt = p->timeInt + lVar12 + lVar11;
                          if (local_4c == *(int *)((long)&local_58->field_0 + 4) + -2) {
                            if (local_38 == (uint *)0x0) {
                              __assert_fail("puTruth",
                                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resCore.c"
                                            ,0x17c,
                                            "int Abc_NtkResynthesize(Abc_Ntk_t *, Res_Par_t *)");
                            }
                            pGraph = Kit_TruthToGraph(local_38,local_4c,p->vMem);
                            local_58 = Kit_GraphToHop((Hop_Man_t *)pNtk->pManFunc,pGraph);
                            Kit_GraphFree(pGraph);
                            iVar4 = clock_gettime(3,&local_70);
                            if (iVar4 < 0) {
                              lVar11 = 1;
                            }
                            else {
                              lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                                              SEXT816(local_70.tv_nsec),8);
                              lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) +
                                       local_70.tv_sec * -1000000;
                            }
                            if (p->vResubsW->nSize <= (int)lVar10) goto LAB_0048595b;
                            Res_UpdateNetwork(pNode,(Vec_Ptr_t *)p->vResubsW->pArray[lVar10],
                                              local_58,p->vLevels);
                            iVar4 = clock_gettime(3,&local_70);
                            if (iVar4 < 0) {
                              lVar10 = -1;
                            }
                            else {
                              lVar10 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
                            }
                            p->timeUpd = p->timeUpd + lVar10 + lVar11;
                            p_00 = local_60;
                            break;
                          }
                        }
                        lVar10 = lVar10 + 1;
                        pVVar8 = p->vResubs;
                        p_00 = local_60;
                      } while (lVar10 < pVVar8->nSize);
                    }
                  }
                }
                else {
                  p->nConstsUsed = p->nConstsUsed + 1;
                  if (iVar4 == 0) {
                    pFunc = (Hop_Obj_t *)(*(ulong *)((long)pNtk->pManFunc + 0x18) ^ 1);
                  }
                  else {
LAB_00485399:
                    pFunc = *(Hop_Obj_t **)((long)pNtk->pManFunc + 0x18);
                  }
                  if (p->vResubsW->nSize < 1) {
LAB_0048595b:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
                  }
                  pVVar6 = (Vec_Ptr_t *)*p->vResubsW->pArray;
                  pVVar6->nSize = 0;
                  Res_UpdateNetwork(pNode,pVVar6,pFunc,p->vLevels);
                }
              }
            }
          }
        }
        lVar13 = lVar13 + 1;
        pVVar6 = pNtk->vObjs;
      } while (lVar13 < pVVar6->nSize);
    }
    Extra_ProgressBarStop(p_00);
    Abc_NtkStopReverseLevels(pNtk);
    lVar13 = p->timeSatSim + p->pSim->timeSat;
    p->timeSatSim = lVar13;
    p->timeSatTotal = lVar13 + p->timeSatSat + p->timeSatUnsat;
    iVar4 = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalNets2 = iVar4;
    p->nTotalNodes2 = pNtk->nObjCounts[7];
    iVar4 = clock_gettime(3,&local_70);
    lVar13 = local_40;
    lVar11 = -1;
    lVar10 = -1;
    if (-1 < iVar4) {
      lVar10 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    p->timeTotal = lVar10 - local_40;
    Res_ManFree(p);
    iVar4 = clock_gettime(3,&local_70);
    if (-1 < iVar4) {
      lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    s_ResynTime = s_ResynTime + (lVar11 - lVar13);
    iVar4 = Abc_NtkCheck(pNtk);
    iVar5 = 1;
    if (iVar4 == 0) {
      fwrite("Abc_NtkResynthesize(): Network check has failed.\n",0x31,1,_stdout);
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int Abc_NtkResynthesize( Abc_Ntk_t * pNtk, Res_Par_t * pPars )
{
    ProgressBar * pProgress;
    Res_Man_t * p;
    Abc_Obj_t * pObj;
    Hop_Obj_t * pFunc;
    Kit_Graph_t * pGraph;
    Vec_Ptr_t * vFanins;
    unsigned * puTruth;
    int i, k, RetValue, nNodesOld, nFanins, nFaninsMax;
    abctime clk, clkTotal = Abc_Clock();

    // start the manager
    p = Res_ManAlloc( pPars );
    p->nTotalNets = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalNodes = Abc_NtkNodeNum(pNtk);
    nFaninsMax = Abc_NtkGetFaninMax(pNtk);
    if ( nFaninsMax > 8 )
        nFaninsMax = 8;

    // perform the network sweep
    Abc_NtkSweep( pNtk, 0 );

    // convert into the AIG
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        Res_ManFree( p );
        return 0;
    }
    assert( Abc_NtkHasAig(pNtk) );

    // set the number of levels
    Abc_NtkLevel( pNtk );
    Abc_NtkStartReverseLevels( pNtk, pPars->nGrowthLevel );

    // try resynthesizing nodes in the topological order
    nNodesOld = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodesOld );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        if ( !Abc_ObjIsNode(pObj) )
            continue;
        if ( Abc_ObjFaninNum(pObj) > 8 )
            continue;
        if ( pObj->Id > nNodesOld )
            break;

        // create the window for this node
clk = Abc_Clock();
        RetValue = Res_WinCompute( pObj, p->pPars->nWindow/10, p->pPars->nWindow%10, p->pWin );
p->timeWin += Abc_Clock() - clk;
        if ( !RetValue )
            continue;
        p->nWinsTriv += Res_WinIsTrivial( p->pWin );

        if ( p->pPars->fVeryVerbose )
        {
            printf( "%5d (lev=%2d) : ", pObj->Id, pObj->Level );
            printf( "Win = %3d/%3d/%4d/%3d   ", 
                Vec_PtrSize(p->pWin->vLeaves), 
                Vec_PtrSize(p->pWin->vBranches),
                Vec_PtrSize(p->pWin->vNodes), 
                Vec_PtrSize(p->pWin->vRoots) );
        }

        // collect the divisors
clk = Abc_Clock();
        Res_WinDivisors( p->pWin, Abc_ObjRequiredLevel(pObj) - 1 );
p->timeDiv += Abc_Clock() - clk;

        p->nWins++;
        p->nWinNodes += Vec_PtrSize(p->pWin->vNodes);
        p->nDivNodes += Vec_PtrSize( p->pWin->vDivs);

        if ( p->pPars->fVeryVerbose )
        {
            printf( "D = %3d ", Vec_PtrSize(p->pWin->vDivs) );
            printf( "D+ = %3d ", p->pWin->nDivsPlus );
        }

        // create the AIG for the window
clk = Abc_Clock();
        if ( p->pAig ) Abc_NtkDelete( p->pAig );
        p->pAig = Res_WndStrash( p->pWin );
p->timeAig += Abc_Clock() - clk;

        if ( p->pPars->fVeryVerbose )
        {
            printf( "AIG = %4d ", Abc_NtkNodeNum(p->pAig) );
            printf( "\n" );
        }
 
        // prepare simulation info
clk = Abc_Clock();
        RetValue = Res_SimPrepare( p->pSim, p->pAig, Vec_PtrSize(p->pWin->vLeaves), 0 ); //p->pPars->fVerbose );
p->timeSim += Abc_Clock() - clk;
        if ( !RetValue )
        {
            p->nSimEmpty++;
            continue;
        }

        // consider the case of constant node
        if ( p->pSim->fConst0 || p->pSim->fConst1 )
        {
            p->nConstsUsed++;

            pFunc = p->pSim->fConst1? Hop_ManConst1((Hop_Man_t *)pNtk->pManFunc) : Hop_ManConst0((Hop_Man_t *)pNtk->pManFunc);
            vFanins = Vec_VecEntry( p->vResubsW, 0 );
            Vec_PtrClear( vFanins );
            Res_UpdateNetwork( pObj, vFanins, pFunc, p->vLevels );
            continue;
        }

//        printf( " " );

        // find resub candidates for the node
clk = Abc_Clock();
        if ( p->pPars->fArea )
            RetValue = Res_FilterCandidates( p->pWin, p->pAig, p->pSim, p->vResubs, p->vResubsW, nFaninsMax, 1 );
        else
            RetValue = Res_FilterCandidates( p->pWin, p->pAig, p->pSim, p->vResubs, p->vResubsW, nFaninsMax, 0 );
p->timeCand += Abc_Clock() - clk;
        p->nCandSets += RetValue;
        if ( RetValue == 0 )
            continue;

//        printf( "%d(%d) ", Vec_PtrSize(p->pWin->vDivs), RetValue );

        p->nWinsUsed++;

        // iterate through candidate resubstitutions
        Vec_VecForEachLevel( p->vResubs, vFanins, k )
        {
            if ( Vec_PtrSize(vFanins) == 0 )
                break;

            // solve the SAT problem and get clauses
clk = Abc_Clock();
            if ( p->pCnf ) Sto_ManFree( p->pCnf );
            p->pCnf = (Sto_Man_t *)Res_SatProveUnsat( p->pAig, vFanins );
            if ( p->pCnf == NULL )
            {
p->timeSatSat += Abc_Clock() - clk;
//                printf( " Sat\n" );
//                printf( "-" );
                continue;
            }
p->timeSatUnsat += Abc_Clock() - clk;
//            printf( "+" );

            p->nProvedSets++;
//            printf( " Unsat\n" );
//            continue;
//            printf( "Proved %d.\n", k );

            // write it into a file
//            Sto_ManDumpClauses( p->pCnf, "trace.cnf" );

            // interpolate the problem if it was UNSAT
clk = Abc_Clock();
            nFanins = Int_ManInterpolate( p->pMan, p->pCnf, 0, &puTruth );
p->timeInt += Abc_Clock() - clk;
            if ( nFanins != Vec_PtrSize(vFanins) - 2 )
                continue;
            assert( puTruth );
//            Extra_PrintBinary( stdout, puTruth, 1 << nFanins );  printf( "\n" );

            // transform interpolant into the AIG
            pGraph = Kit_TruthToGraph( puTruth, nFanins, p->vMem );

            // derive the AIG for the decomposition tree
            pFunc = Kit_GraphToHop( (Hop_Man_t *)pNtk->pManFunc, pGraph );
            Kit_GraphFree( pGraph );

            // update the network
clk = Abc_Clock();
            Res_UpdateNetwork( pObj, Vec_VecEntry(p->vResubsW, k), pFunc, p->vLevels );
p->timeUpd += Abc_Clock() - clk;
            break;
        }
//        printf( "\n" );
    }
    Extra_ProgressBarStop( pProgress );
    Abc_NtkStopReverseLevels( pNtk );

p->timeSatSim += p->pSim->timeSat;
p->timeSatTotal = p->timeSatSat + p->timeSatUnsat + p->timeSatSim;

    p->nTotalNets2 = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalNodes2 = Abc_NtkNodeNum(pNtk);

    // quit resubstitution manager
p->timeTotal = Abc_Clock() - clkTotal;
    Res_ManFree( p );

s_ResynTime += Abc_Clock() - clkTotal;
    // check the resulting network
    if ( !Abc_NtkCheck( pNtk ) )
    {
        fprintf( stdout, "Abc_NtkResynthesize(): Network check has failed.\n" );
        return 0;
    }
    return 1;
}